

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::SequenceMatchListSyntax::SequenceMatchListSyntax
          (SequenceMatchListSyntax *this,Token comma,
          SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *items)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  PropertyExprSyntax *pPVar4;
  undefined8 uVar5;
  ulong uVar6;
  size_t index;
  
  uVar5 = comma._0_8_;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).kind = SequenceMatchList;
  (this->comma).kind = (short)uVar5;
  (this->comma).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->comma).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->comma).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->comma).info = comma.info;
  SVar2 = (items->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent =
       (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004edc60;
  sVar1 = (items->elements).size_;
  (this->items).elements.data_ = (items->elements).data_;
  (this->items).elements.size_ = sVar1;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar6 = (this->items).elements.size_ + 1;
  if (1 < uVar6) {
    index = 0;
    do {
      pPVar4 = SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::operator[]
                         (&this->items,index);
      (pPVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
      index = index + 1;
    } while (uVar6 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}